

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O2

int If_CutDsdBalanceEvalInt
              (If_DsdMan_t *p,int iDsd,int *pTimes,Vec_Int_t *vAig,int *pArea,char *pPermLits)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iLit;
  int nSupp;
  int local_3c;
  int *local_38;
  
  nSupp = 0;
  iLit = 0;
  local_38 = pArea;
  iVar1 = If_DsdVecLitSuppSize(&p->vObjs,iDsd);
  local_3c = iDsd;
  iVar2 = Abc_Lit2Var(iDsd);
  iVar2 = If_CutDsdBalanceEval_rec(p,iVar2,pTimes,&nSupp,vAig,&iLit,iVar1,local_38,pPermLits);
  if (iVar2 != -1) {
    if (nSupp != iVar1) {
      __assert_fail("nSupp == nSuppAll",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/if/ifDsd.c"
                    ,0x90b,
                    "int If_CutDsdBalanceEvalInt(If_DsdMan_t *, int, int *, Vec_Int_t *, int *, char *)"
                   );
    }
    if (vAig != (Vec_Int_t *)0x0) {
      iVar3 = Abc_Lit2Var(iLit);
      iVar1 = nSupp;
      iVar4 = Abc_Lit2Var(vAig->nSize);
      if (iVar3 != iVar4 + iVar1 + -1) {
        __assert_fail("vAig == NULL || Abc_Lit2Var(iLit) == nSupp + Abc_Lit2Var(Vec_IntSize(vAig)) - 1"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/if/ifDsd.c"
                      ,0x90c,
                      "int If_CutDsdBalanceEvalInt(If_DsdMan_t *, int, int *, Vec_Int_t *, int *, char *)"
                     );
      }
      uVar5 = Abc_LitIsCompl(iLit);
      uVar6 = Abc_LitIsCompl(local_3c);
      Vec_IntPush(vAig,uVar5 ^ uVar6);
      if ((vAig->nSize & 1) == 0) {
        __assert_fail("vAig == NULL || (Vec_IntSize(vAig) & 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/if/ifDsd.c"
                      ,0x90f,
                      "int If_CutDsdBalanceEvalInt(If_DsdMan_t *, int, int *, Vec_Int_t *, int *, char *)"
                     );
      }
    }
  }
  return iVar2;
}

Assistant:

int If_CutDsdBalanceEvalInt( If_DsdMan_t * p, int iDsd, int * pTimes, Vec_Int_t * vAig, int * pArea, char * pPermLits )
{
    int nSupp = 0, iLit = 0;
    int nSuppAll = If_DsdVecLitSuppSize( &p->vObjs, iDsd );
    int Res = If_CutDsdBalanceEval_rec( p, Abc_Lit2Var(iDsd), pTimes, &nSupp, vAig, &iLit, nSuppAll, pArea, pPermLits );
    if ( Res == -1 )
        return -1;
    assert( nSupp == nSuppAll );
    assert( vAig == NULL || Abc_Lit2Var(iLit) == nSupp + Abc_Lit2Var(Vec_IntSize(vAig)) - 1 );
    if ( vAig )
        Vec_IntPush( vAig, Abc_LitIsCompl(iLit) ^ Abc_LitIsCompl(iDsd) );
    assert( vAig == NULL || (Vec_IntSize(vAig) & 1) );
    return Res;
}